

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UCharsTrieBuilder::writeElementUnits
          (UCharsTrieBuilder *this,int32_t i,int32_t unitIndex,int32_t length)

{
  ssize_t sVar1;
  UnicodeString local_60;
  
  UCharsTrieElement::getString(&local_60,this->elements + i,&this->strings);
  if ((local_60.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
    if ((local_60.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      local_60.fUnion._16_4_ = (int)&local_60 + 10;
    }
  }
  else {
    local_60.fUnion._16_4_ = 0;
  }
  sVar1 = write(this,local_60.fUnion._16_4_ + unitIndex * 2,(void *)(ulong)(uint)length,
                (long)unitIndex);
  UnicodeString::~UnicodeString(&local_60);
  return (int32_t)sVar1;
}

Assistant:

int32_t
UCharsTrieBuilder::writeElementUnits(int32_t i, int32_t unitIndex, int32_t length) {
    return write(elements[i].getString(strings).getBuffer()+unitIndex, length);
}